

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendstate.c
# Opt level: O0

int check_amount_of_state(quicly_sendstate_t *state)

{
  ulong uVar1;
  int64_t bytes_buffered;
  size_t num_ranges;
  quicly_sendstate_t *state_local;
  int local_4;
  
  uVar1 = (state->acked).num_ranges + (state->pending).num_ranges;
  if (uVar1 < 0x100) {
    local_4 = 0;
  }
  else if ((long)(state->size_inflight - ((state->acked).ranges)->end) < (long)(uVar1 * 0x80)) {
    local_4 = 0xff07;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int check_amount_of_state(quicly_sendstate_t *state)
{
    size_t num_ranges = state->acked.num_ranges + state->pending.num_ranges;

    /* Bail out if number of gaps are small.
     * In case of HTTP/3, the worst case is when each HTTP request is received as a separate QUIC packet, and sending a small STREAM
     * frame carrying a HPACK encoder / decoder in response. If half of those STREAM frames are lost (note: loss of every other
     * packet can happen during slow start), `num_ranges` can become as large as `request_concurrency * 2`, as each gaps will be
     * recognized in `acked.num_ranges` and `pending.num_ranges`. */
    if (PTLS_LIKELY(num_ranges < 256))
        return 0;

    /* When there are large number of gaps, make sure that the amount of state retained in quicly is relatively smaller than the
     * amount of state retained by application (in form of the stream-level send buffer). 512 is used as the threshold, based on the
     * assumption that the STREAM frames that have been sent are on average at least 512 bytes long, when seeing excess number of
     * gaps. */
    int64_t bytes_buffered = (int64_t)state->size_inflight - (int64_t)state->acked.ranges[0].end;
    if ((int64_t)num_ranges * 128 > bytes_buffered)
        return QUICLY_ERROR_STATE_EXHAUSTION;

    return 0;
}